

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonEndElement(void *user_data,xmlChar *name)

{
  int iVar1;
  PyObject *pPVar2;
  long lVar3;
  PyObject *result;
  PyObject *handler;
  xmlChar *name_local;
  void *user_data_local;
  
  iVar1 = PyObject_HasAttrString(user_data,"endElement");
  if (iVar1 == 0) {
    iVar1 = PyObject_HasAttrString(user_data,"end");
    if (iVar1 != 0) {
      pPVar2 = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"end","s",name);
      lVar3 = PyErr_Occurred();
      if (lVar3 != 0) {
        PyErr_Print();
      }
      _Py_XDECREF(pPVar2);
    }
  }
  else {
    pPVar2 = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"endElement","s",name);
    lVar3 = PyErr_Occurred();
    if (lVar3 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(pPVar2);
  }
  return;
}

Assistant:

static void
pythonEndElement(void *user_data, const xmlChar * name)
{
    PyObject *handler;
    PyObject *result;

#ifdef DEBUG_SAX
    printf("pythonEndElement(%s) called\n", name);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "endElement")) {
        result = PyObject_CallMethod(handler, (char *) "endElement",
                                     (char *) "s", name);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    } else if (PyObject_HasAttrString(handler, (char *) "end")) {
        result = PyObject_CallMethod(handler, (char *) "end",
                                     (char *) "s", name);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}